

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalCommonGenerator.cxx
# Opt level: O0

string * __thiscall
cmGlobalCommonGenerator::GetEditCacheCommand_abi_cxx11_
          (string *__return_storage_ptr__,cmGlobalCommonGenerator *this)

{
  undefined8 uVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  string *psVar5;
  ulong uVar6;
  byte local_151;
  allocator<char> local_119;
  string local_118;
  cmValue local_f8;
  cmValue edit_cmd;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_89;
  string local_88;
  cmValue local_68;
  undefined1 local_60 [8];
  string editCacheCommand;
  cmake *cm;
  cmGlobalCommonGenerator *local_18;
  cmGlobalCommonGenerator *this_local;
  
  local_18 = this;
  this_local = (cmGlobalCommonGenerator *)__return_storage_ptr__;
  cmGlobalGenerator::GetExtraGeneratorName_abi_cxx11_((string *)&cm,&this->super_cmGlobalGenerator);
  bVar2 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)&cm);
  if (((bVar2 ^ 0xff) & 1) == 0) {
    editCacheCommand.field_2._8_8_ =
         cmGlobalGenerator::GetCMakeInstance(&this->super_cmGlobalGenerator);
    psVar5 = cmake::GetCMakeEditCommand_abi_cxx11_((cmake *)editCacheCommand.field_2._8_8_);
    std::__cxx11::string::string((string *)local_60,(string *)psVar5);
    uVar1 = editCacheCommand.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"CMAKE_EDIT_COMMAND",&local_89);
    local_68 = cmake::GetCacheDefinition((cmake *)uVar1,&local_88);
    bVar3 = cmValue::operator_cast_to_bool(&local_68);
    local_151 = 1;
    if (bVar3) {
      local_151 = std::__cxx11::string::empty();
      local_151 = local_151 ^ 0xff;
    }
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
    if ((local_151 & 1) != 0) {
      uVar4 = (*(this->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[0x44])();
      if (((uVar4 & 1) != 0) && (uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) != 0)) {
        psVar5 = cmSystemTools::GetCMakeCursesCommand_abi_cxx11_();
        std::__cxx11::string::operator=((string *)local_60,(string *)psVar5);
      }
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) != 0) {
        psVar5 = cmSystemTools::GetCMakeGUICommand_abi_cxx11_();
        std::__cxx11::string::operator=((string *)local_60,(string *)psVar5);
      }
      uVar6 = std::__cxx11::string::empty();
      uVar1 = editCacheCommand.field_2._8_8_;
      if ((uVar6 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c0,"CMAKE_EDIT_COMMAND",&local_c1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e8,"Path to cache edit program executable.",
                   (allocator<char> *)((long)&edit_cmd.Value + 7));
        cmake::AddCacheEntry((cmake *)uVar1,&local_c0,(string *)local_60,&local_e8,4);
        std::__cxx11::string::~string((string *)&local_e8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&edit_cmd.Value + 7));
        std::__cxx11::string::~string((string *)&local_c0);
        std::allocator<char>::~allocator(&local_c1);
      }
    }
    uVar1 = editCacheCommand.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"CMAKE_EDIT_COMMAND",&local_119);
    local_f8 = cmake::GetCacheDefinition((cmake *)uVar1,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
    bVar3 = cmValue::operator_cast_to_bool(&local_f8);
    if (bVar3) {
      psVar5 = cmValue::operator*[abi_cxx11_(&local_f8);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar5);
    }
    else {
      std::__cxx11::string::string((string *)__return_storage_ptr__);
    }
    std::__cxx11::string::~string((string *)local_60);
  }
  else {
    psVar5 = cmSystemTools::GetCMakeGUICommand_abi_cxx11_();
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalCommonGenerator::GetEditCacheCommand() const
{
  // If generating for an extra IDE, the edit_cache target cannot
  // launch a terminal-interactive tool, so always use cmake-gui.
  if (!this->GetExtraGeneratorName().empty()) {
    return cmSystemTools::GetCMakeGUICommand();
  }

  // Use an internal cache entry to track the latest dialog used
  // to edit the cache, and use that for the edit_cache target.
  cmake* cm = this->GetCMakeInstance();
  std::string editCacheCommand = cm->GetCMakeEditCommand();
  if (!cm->GetCacheDefinition("CMAKE_EDIT_COMMAND") ||
      !editCacheCommand.empty()) {
    if (this->SupportsDirectConsole() && editCacheCommand.empty()) {
      editCacheCommand = cmSystemTools::GetCMakeCursesCommand();
    }
    if (editCacheCommand.empty()) {
      editCacheCommand = cmSystemTools::GetCMakeGUICommand();
    }
    if (!editCacheCommand.empty()) {
      cm->AddCacheEntry("CMAKE_EDIT_COMMAND", editCacheCommand,
                        "Path to cache edit program executable.",
                        cmStateEnums::INTERNAL);
    }
  }
  cmValue edit_cmd = cm->GetCacheDefinition("CMAKE_EDIT_COMMAND");
  return edit_cmd ? *edit_cmd : std::string();
}